

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O2

int __thiscall MPEG2StreamReader::processSeqStartCode(MPEG2StreamReader *this,uint8_t *buff)

{
  uint8_t *nextNal;
  uint8_t *puVar1;
  int iVar2;
  
  nextNal = MPEGHeader::findNextMarker
                      (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  iVar2 = -10;
  if (nextNal != (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd) {
    puVar1 = MPEGSequenceHeader::deserialize
                       (&this->m_sequence,buff + 1,(int64_t)(nextNal + ~(ulong)buff));
    if (puVar1 == (uint8_t *)0x0) {
      iVar2 = 3;
    }
    else {
      (this->super_MPEGStreamReader).m_streamAR = (uint)(this->m_sequence).aspect_ratio_info;
      iVar2 = 0;
      MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,(void *)0x0,buff,nextNal,0);
      this->spsFound = true;
      this->m_lastIFrame = true;
    }
  }
  return iVar2;
}

Assistant:

int MPEG2StreamReader::processSeqStartCode(uint8_t* buff)
{
    uint8_t* nextNal = MPEGHeader::findNextMarker(buff, m_bufEnd);
    if (nextNal == m_bufEnd)
    {
        return NOT_ENOUGH_BUFFER;
    }
    try
    {
        if (m_sequence.deserialize(buff + 1, nextNal - buff - 1) == nullptr)
            return NALUnit::UNSUPPORTED_PARAM;
        m_streamAR = static_cast<VideoAspectRatio>(m_sequence.aspect_ratio_info);
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
    constexpr int oldSpsLen = 0;
    updateFPS(nullptr, buff, nextNal, oldSpsLen);
    spsFound = true;
    m_lastIFrame = true;
    return 0;
}